

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void openSwitches(Graph *g,int *ids,int n)

{
  int originID;
  int destinyID;
  Edge *pEVar1;
  Vertex *pVVar2;
  int local_2c;
  int i;
  Edge *a;
  int n_local;
  int *ids_local;
  Graph *g_local;
  
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    pEVar1 = Graph::findEdge(g,ids[local_2c]);
    Edge::setSwitch(pEVar1,false);
    pVVar2 = Edge::getDestiny(pEVar1);
    originID = Vertex::getID(pVVar2);
    pVVar2 = Edge::getOrigin(pEVar1);
    destinyID = Vertex::getID(pVVar2);
    pEVar1 = Graph::findEdge(g,originID,destinyID);
    Edge::setSwitch(pEVar1,false);
  }
  return;
}

Assistant:

void openSwitches(Graph *g, int *ids, int n) {
    Edge *a;
    for (int i = 0; i < n; i++) {
        a = g->findEdge(ids[i]);
        a->setSwitch(false);
        a = g->findEdge(a->getDestiny()->getID(), a->getOrigin()->getID());
        a->setSwitch(false);
    }
}